

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naming.cc
# Opt level: O3

string_view __thiscall
google::protobuf::compiler::rust::MultiCasePrefixStripper::StripPrefix
          (MultiCasePrefixStripper *this,string_view name)

{
  long lVar1;
  char cVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  size_t sVar6;
  long lVar7;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
  *__range3;
  string_view sVar8;
  
  pcVar4 = name._M_str;
  sVar6 = name._M_len;
  lVar7 = 8;
  do {
    lVar1 = *(long *)((long)&(this->prefixes_)._M_elems[0]._M_dataplus._M_p + lVar7);
    cVar2 = absl::lts_20240722::StartsWithIgnoreCase
                      (sVar6,pcVar4,lVar1,
                       *(undefined8 *)((long)(this->prefixes_)._M_elems + lVar7 + -8));
    if (cVar2 != '\0') {
      pcVar5 = pcVar4 + lVar1;
      sVar3 = sVar6 - lVar1;
      if (sVar3 == 0) {
        sVar3 = 0;
      }
      else if (*pcVar5 == '_') {
        sVar3 = sVar3 - 1;
        pcVar5 = pcVar5 + 1;
      }
      break;
    }
    lVar7 = lVar7 + 0x20;
    sVar3 = sVar6;
    pcVar5 = pcVar4;
  } while (lVar7 != 0x68);
  if (sVar3 == 0) {
    pcVar5 = pcVar4;
    sVar3 = sVar6;
  }
  sVar8._M_str = pcVar5;
  sVar8._M_len = sVar3;
  return sVar8;
}

Assistant:

absl::string_view MultiCasePrefixStripper::StripPrefix(
    absl::string_view name) const {
  absl::string_view start_name = name;
  for (absl::string_view prefix : prefixes_) {
    if (absl::StartsWithIgnoreCase(name, prefix)) {
      name.remove_prefix(prefix.size());

      // Also strip a joining underscore, if present.
      absl::ConsumePrefix(&name, "_");

      // Only strip one prefix.
      break;
    }
  }

  if (name.empty()) {
    return start_name;
  }
  return name;
}